

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O3

void __thiscall CBroadcast::RenderServerBroadcast(CBroadcast *this)

{
  CTextCursor *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  CGameClient *pCVar3;
  IGraphics *pIVar4;
  ITextRender *pIVar5;
  _func_int **pp_Var6;
  long lVar7;
  long in_FS_OFFSET;
  float fVar8;
  float fVar9;
  float fVar10;
  CTextBoundingBox CVar11;
  CUIRect BroadcastView;
  vec4 local_40;
  CUIRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (this->super_CComponent).m_pClient;
  if ((((pCVar3->m_pConfig->m_ClShowServerBroadcast != 0) && (this->m_MuteServerBroadcast == false))
      && (0 < (this->m_ServerBroadcastCursor).m_Glyphs.num_elements)) &&
     (pCVar3->m_pChat->m_Mode == 0)) {
    fVar8 = pCVar3->m_pClient->m_LocalTime - this->m_ServerBroadcastReceivedTime;
    if (fVar8 <= 10.0) {
      this_00 = &this->m_ServerBroadcastCursor;
      pIVar4 = pCVar3->m_pGraphics;
      uVar1 = pIVar4->m_ScreenWidth;
      uVar2 = pIVar4->m_ScreenHeight;
      fVar10 = ((float)(int)uVar1 / (float)(int)uVar2) * 300.0;
      (*(pIVar4->super_IInterface)._vptr_IInterface[5])(0,0,fVar10);
      fVar8 = fVar8 + -9.0;
      fVar9 = 0.0;
      if (0.0 <= fVar8) {
        fVar9 = fVar8;
      }
      fVar9 = 1.0 - fVar9;
      CVar11 = CTextCursor::AlignedBoundingBox(this_00);
      fVar8 = CVar11.h;
      local_30.w = fVar10 * 0.5;
      local_30.h = fVar8;
      if (fVar8 <= 10.0) {
        local_30.h = 10.0;
      }
      local_30.h = local_30.h + 2.0;
      local_30.x = local_30.w * 0.5;
      local_30.y = 300.0 - local_30.h;
      local_40.field_3.w = fVar9 * 0.25;
      local_40.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
      local_40.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
      local_40.field_2.z = 0.0;
      CUIRect::Draw(&local_30,&local_40,5.0,3);
      (this->m_ServerBroadcastCursor).m_CursorPos.field_0.x = local_30.w * 0.5 + local_30.x;
      (this->m_ServerBroadcastCursor).m_CursorPos.field_1.y =
           (local_30.h * 0.5 + local_30.y) - fVar8 * 0.5;
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x11])
                (0x400000003f800000,fVar9,pIVar5,this_00,0,
                 (ulong)(uint)this->m_aServerBroadcastSegments[0].m_GlyphPos);
      if (0 < this->m_NumSegments) {
        lVar7 = 0;
        do {
          pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          pp_Var6 = (pIVar5->super_IInterface)._vptr_IInterface;
          if (this->m_aServerBroadcastSegments[lVar7].m_IsHighContrast == true) {
            (*pp_Var6[0x10])((ulong)(uint)fVar9,pIVar5,this_00);
          }
          else {
            (*pp_Var6[0x11])(0x400000003f800000,fVar9,pIVar5,this_00,
                             (ulong)(uint)this->m_aServerBroadcastSegments[lVar7].m_GlyphPos,
                             (ulong)(uint)this->m_aServerBroadcastSegments[lVar7 + 1].m_GlyphPos);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < this->m_NumSegments);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBroadcast::RenderServerBroadcast()
{
	if(!Config()->m_ClShowServerBroadcast || m_MuteServerBroadcast || !m_ServerBroadcastCursor.Rendered())
		return;
	if(m_pClient->m_pChat->IsActive())
		return;

	const float DisplayDuration = 10.0f;
	const float DisplayStartFade = 9.0f;
	const float DeltaTime = Client()->LocalTime() - m_ServerBroadcastReceivedTime;

	if(DeltaTime > DisplayDuration)
		return;

	const float Height = 300;
	const float Width = Height*Graphics()->ScreenAspect();
	Graphics()->MapScreen(0, 0, Width, Height);

	const float Fade = 1.0f - maximum(0.0f, (DeltaTime - DisplayStartFade) / (DisplayDuration - DisplayStartFade));
	const float TextHeight = m_ServerBroadcastCursor.BoundingBox().h;
	const float Rounding = 5.0f;

	CUIRect BroadcastView;
	BroadcastView.w = Width * 0.5f;
	BroadcastView.h = maximum(TextHeight, 2*Rounding) + 2.0f;
	BroadcastView.x = BroadcastView.w * 0.5f;
	BroadcastView.y = Height - BroadcastView.h;

	BroadcastView.Draw(vec4(0.0f, 0.0f, 0.0f, 0.25f * Fade), Rounding, CUIRect::CORNER_T);

	// draw lines
	const vec2 ShadowOffset(1.0f, 2.0f);
	m_ServerBroadcastCursor.MoveTo(BroadcastView.x + BroadcastView.w/2, BroadcastView.y + BroadcastView.h/2 - TextHeight/2);

	TextRender()->DrawTextShadowed(&m_ServerBroadcastCursor, ShadowOffset, Fade, 0, m_aServerBroadcastSegments[0].m_GlyphPos);
	for(int i = 0; i < m_NumSegments; ++i)
	{
		CBroadcastSegment *pSegment = &m_aServerBroadcastSegments[i];
		if(m_aServerBroadcastSegments[i].m_IsHighContrast)
			TextRender()->DrawTextOutlined(&m_ServerBroadcastCursor, Fade, pSegment->m_GlyphPos, (pSegment+1)->m_GlyphPos);
		else
			TextRender()->DrawTextShadowed(&m_ServerBroadcastCursor, ShadowOffset, Fade, pSegment->m_GlyphPos, (pSegment+1)->m_GlyphPos);
	}
}